

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O3

int64_t av1_delta_rate_cost(int64_t delta_rate,int64_t recrf_dist,int64_t srcrf_dist,int pix_num)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  if (0x80 < srcrf_dist) {
    dVar1 = (double)srcrf_dist / (double)recrf_dist;
    dVar3 = (double)(delta_rate >> 0xd) / (double)pix_num;
    dVar2 = log(dVar1);
    dVar2 = dVar3 + dVar3 + dVar2 / 0.6931471805599453;
    if (dVar2 <= 3.3219280948873626) {
      dVar2 = exp2(dVar2);
      dVar1 = dVar2 / (dVar1 * dVar2 + (1.0 - dVar1) * dVar1);
    }
    else {
      dVar1 = 1.0 / dVar1;
    }
    dVar2 = log(dVar1);
    delta_rate = (long)(((dVar2 * (double)pix_num) / 0.6931471805599453) * 0.5) << 0xd;
  }
  return delta_rate;
}

Assistant:

int64_t av1_delta_rate_cost(int64_t delta_rate, int64_t recrf_dist,
                            int64_t srcrf_dist, int pix_num) {
  double beta = (double)srcrf_dist / recrf_dist;
  int64_t rate_cost = delta_rate;

  if (srcrf_dist <= 128) return rate_cost;

  double dr =
      (double)(delta_rate >> (TPL_DEP_COST_SCALE_LOG2 + AV1_PROB_COST_SHIFT)) /
      pix_num;

  double log_den = log(beta) / log(2.0) + 2.0 * dr;

  if (log_den > log(10.0) / log(2.0)) {
    rate_cost = (int64_t)((log(1.0 / beta) * pix_num) / log(2.0) / 2.0);
    rate_cost <<= (TPL_DEP_COST_SCALE_LOG2 + AV1_PROB_COST_SHIFT);
    return rate_cost;
  }

  double num = pow(2.0, log_den);
  double den = num * beta + (1 - beta) * beta;

  rate_cost = (int64_t)((pix_num * log(num / den)) / log(2.0) / 2.0);

  rate_cost <<= (TPL_DEP_COST_SCALE_LOG2 + AV1_PROB_COST_SHIFT);

  return rate_cost;
}